

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeMapPrototype
               (DynamicObject *mapPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *pSVar1;
  undefined8 in_RAX;
  uint uVar4;
  JavascriptFunction *pJVar2;
  JavascriptString *pJVar3;
  ulong uVar5;
  
  uVar4 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,mapPrototype,mode,0xd,1);
  this = (((mapPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar1 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar5 = (ulong)uVar4 << 0x20;
  (*(mapPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (mapPrototype,0x67,(this->super_JavascriptLibraryBase).mapConstructor.ptr,6,0,0,uVar5);
  AddFunctionToLibraryObject
            (this,mapPrototype,0x62,(FunctionInfo *)JavascriptMap::EntryInfo::Clear,0,'\x06');
  AddFunctionToLibraryObject
            (this,mapPrototype,0x6f,(FunctionInfo *)JavascriptMap::EntryInfo::Delete,1,'\x06');
  AddFunctionToLibraryObject
            (this,mapPrototype,0x93,(FunctionInfo *)JavascriptMap::EntryInfo::ForEach,1,'\x06');
  AddFunctionToLibraryObject
            (this,mapPrototype,0x198,(FunctionInfo *)JavascriptMap::EntryInfo::Get,1,'\x06');
  AddFunctionToLibraryObject
            (this,mapPrototype,0xb4,(FunctionInfo *)JavascriptMap::EntryInfo::Has,1,'\x06');
  AddFunctionToLibraryObject
            (this,mapPrototype,0x19b,(FunctionInfo *)JavascriptMap::EntryInfo::Set,2,'\x06');
  AddAccessorsToLibraryObject
            (this,mapPrototype,0x14f,(FunctionInfo *)JavascriptMap::EntryInfo::SizeGetter,
             (FunctionInfo *)0x0);
  pJVar2 = AddFunctionToLibraryObject
                     (this,mapPrototype,0x7a,(FunctionInfo *)JavascriptMap::EntryInfo::Entries,0,
                      '\x06');
  AddFunctionToLibraryObject
            (this,mapPrototype,0xcf,(FunctionInfo *)JavascriptMap::EntryInfo::Keys,0,'\x06');
  AddFunctionToLibraryObject
            (this,mapPrototype,399,(FunctionInfo *)JavascriptMap::EntryInfo::Values,0,'\x06');
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(mapPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mapPrototype,0x14,pJVar2,6,0,0,uVar5);
  if (((pSVar1->config).threadConfig)->m_ES6ToStringTag == true) {
    pJVar3 = CreateStringFromCppLiteral<4ul>(this,(char16 (*) [4])0xe10c92);
    (*(mapPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mapPrototype,0x1b,pJVar3,2,0,0,uVar5 & 0xffffffff00000000)
    ;
  }
  DynamicObject::SetHasNoEnumerableProperties(mapPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeMapPrototype(DynamicObject* mapPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(mapPrototype, mode, 13, true);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterMap
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = mapPrototype->GetScriptContext();
        JavascriptLibrary* library = mapPrototype->GetLibrary();
        library->AddMember(mapPrototype, PropertyIds::constructor, library->mapConstructor);

        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::clear, &JavascriptMap::EntryInfo::Clear, 0);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::delete_, &JavascriptMap::EntryInfo::Delete, 1);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::forEach, &JavascriptMap::EntryInfo::ForEach, 1);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::get, &JavascriptMap::EntryInfo::Get, 1);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::has, &JavascriptMap::EntryInfo::Has, 1);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::set, &JavascriptMap::EntryInfo::Set, 2);

        library->AddAccessorsToLibraryObject(mapPrototype, PropertyIds::size, &JavascriptMap::EntryInfo::SizeGetter, nullptr);

        JavascriptFunction* entriesFunc;
        entriesFunc = library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::entries, &JavascriptMap::EntryInfo::Entries, 0);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::keys, &JavascriptMap::EntryInfo::Keys, 0);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::values, &JavascriptMap::EntryInfo::Values, 0);
        library->AddMember(mapPrototype, PropertyIds::_symbolIterator, entriesFunc);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(mapPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("Map")), PropertyConfigurable);
        }

        mapPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }